

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void ui_keymap_create(char *title,wchar_t row)

{
  _Bool _Var1;
  uint8_t attr;
  unkuint9 Var2;
  _Bool _Var3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  uint8_t uVar10;
  undefined5 uVar11;
  bool bVar7;
  keypress kVar8;
  keypress kVar9;
  long lStack_470;
  char tmp [1024];
  
  _Var1 = (player->opts).opt[1];
  prt(title,L'\r',L'\0');
  prt("Key: ",L'\x0e',L'\0');
  kVar8 = keymap_get_trigger();
  if (kVar8.code == 0x3d) {
    c_prt('\f',"The \'=\' key is reserved.",L'\x10',L'\x02');
    prt("Press any key to continue.",L'\x12',L'\0');
    inkey();
    return;
  }
  bVar7 = false;
  lStack_470 = 0;
  do {
    lVar4 = lStack_470;
    attr = '\x01';
    if (lVar4 == 0) {
      attr = '\v';
    }
    if (lVar4 == 0x14) {
      attr = '\f';
    }
    do {
      if (bVar7) {
        if ((kVar8._0_8_ >> 0x20 != 0) && (_Var3 = get_check("Keep this keymap? "), _Var3)) {
          Var2 = kVar8._0_9_;
          kVar8._9_3_ = 0;
          kVar8.type = (int)Var2;
          register0x00000034 = (int)(Var2 >> 0x20);
          register0x00000010 = (char)(Var2 >> 0x40);
          keymap_add((uint)_Var1,kVar8,keymap_buffer,true);
          prt("To use in other sessions, save the keymaps to a file.  Press a key to continue.",
              L'\x11',L'\0');
          inkey();
        }
        return;
      }
      keypress_to_text(tmp,0x400,keymap_buffer,false);
      pcVar5 = format("Action: %s",tmp);
      c_prt(attr,pcVar5,L'\x0f',L'\0');
      c_prt('\x0e',"  Press \'=\' when finished.",L'\x11',L'\0');
      c_prt('\x0e',"  Use \'CTRL-u\' to reset.",L'\x12',L'\0');
      pcVar5 = format("(Maximum keymap length is %d keys.)",0x14);
      c_prt('\x0e',pcVar5,L'\x13',L'\0');
      kVar9 = inkey();
      uVar6 = kVar9._0_8_;
      bVar7 = uVar6 >> 0x20 == 0x3d;
    } while (bVar7);
    if (kVar9.code - 0x9e < 2) {
      lStack_470 = 0;
      if (lVar4 != 0) {
        lStack_470 = lVar4 + -1;
        keymap_buffer[lStack_470].mods = '\0';
        keymap_buffer[lStack_470].type = EVT_NONE;
        keymap_buffer[lStack_470].code = 0;
      }
    }
    else if (kVar9.code == 0x15) {
      memset(keymap_buffer,0,0xfc);
      lStack_470 = 0;
    }
    else {
      lStack_470 = 0x14;
      if (lVar4 != 0x14) {
        if (lVar4 == 0) {
          memset(keymap_buffer,0,0xfc);
        }
        keymap_buffer[lVar4].type = (int)uVar6;
        keymap_buffer[lVar4].code = (int)(uVar6 >> 0x20);
        keymap_buffer[lVar4].mods = kVar9.mods;
        lStack_470 = lVar4 + 1;
      }
    }
  } while( true );
}

Assistant:

static void ui_keymap_create(const char *title, int row)
{
	bool done = false;
	size_t n = 0;

	struct keypress c;
	char tmp[1024];
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	prt(title, 13, 0);
	prt("Key: ", 14, 0);

	c = keymap_get_trigger();
	if (c.code == '=') {
		c_prt(COLOUR_L_RED, "The '=' key is reserved.", 16, 2);
		prt("Press any key to continue.", 18, 0);
		inkey();
		return;
	}

	/* Get an encoded action, with a default response */
	while (!done) {
		struct keypress kp = {EVT_NONE, 0, 0};

		int color = COLOUR_WHITE;
		if (n == 0) color = COLOUR_YELLOW;
		if (n == KEYMAP_ACTION_MAX) color = COLOUR_L_RED;

		keypress_to_text(tmp, sizeof(tmp), keymap_buffer, false);
		c_prt(color, format("Action: %s", tmp), 15, 0);

		c_prt(COLOUR_L_BLUE, "  Press '=' when finished.", 17, 0);
		c_prt(COLOUR_L_BLUE, "  Use 'CTRL-u' to reset.", 18, 0);
		c_prt(COLOUR_L_BLUE, format("(Maximum keymap length is %d keys.)",
									KEYMAP_ACTION_MAX), 19, 0);

		kp = inkey();

		if (kp.code == '=') {
			done = true;
			continue;
		}

		switch (kp.code) {
			case KC_DELETE:
			case KC_BACKSPACE: {
				if (n > 0) {
					n -= 1;
				    keymap_buffer[n].type = 0;
					keymap_buffer[n].code = 0;
					keymap_buffer[n].mods = 0;
				}
				break;
			}

			case KTRL('U'): {
				memset(keymap_buffer, 0, sizeof keymap_buffer);
				n = 0;
				break;
			}

			default: {
				if (n == KEYMAP_ACTION_MAX) continue;

				if (n == 0) {
					memset(keymap_buffer, 0, sizeof keymap_buffer);
				}
				keymap_buffer[n++] = kp;
				break;
			}
		}
	}

	if (c.code && get_check("Keep this keymap? ")) {
		keymap_add(mode, c, keymap_buffer, true);
		prt("To use in other sessions, save the keymaps to a file.  Press a key to continue.", 17, 0);
		inkey();
	}
}